

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtAlignedObjectArray.h
# Opt level: O3

void __thiscall
cbtAlignedObjectArray<cbtMaterialProperties>::~cbtAlignedObjectArray
          (cbtAlignedObjectArray<cbtMaterialProperties> *this)

{
  if ((this->m_data != (cbtMaterialProperties *)0x0) && (this->m_ownsMemory == true)) {
    cbtAlignedFreeInternal(this->m_data);
  }
  this->m_ownsMemory = true;
  this->m_data = (cbtMaterialProperties *)0x0;
  this->m_size = 0;
  this->m_capacity = 0;
  return;
}

Assistant:

~cbtAlignedObjectArray()
	{
		clear();
	}